

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cc
# Opt level: O1

optional<NFastBernoulli::TExecutionPlan> *
NFastBernoulli::Quantize
          (optional<NFastBernoulli::TExecutionPlan> *__return_storage_ptr__,double prob,double tol)

{
  undefined1 uVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  undefined1 *puVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined1 *puVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 local_69;
  undefined1 auStack_68 [16];
  TExecutionPlan plan;
  
  plan.Ops_._M_elems[0x30] = Not;
  plan.Ops_._M_elems[0x31] = Not;
  plan.Ops_._M_elems[0x32] = Not;
  plan.Ops_._M_elems[0x33] = Not;
  plan.Ops_._M_elems[0x34] = Not;
  plan.Ops_._M_elems[0x35] = Not;
  plan.Ops_._M_elems[0x36] = Not;
  plan.Ops_._M_elems[0x37] = Not;
  plan.Ops_._M_elems._16_8_ = SUB168(ZEXT816(0) << 0x40,0);
  plan.Ops_._M_elems[0x10] = Not;
  plan.Ops_._M_elems[0x11] = Not;
  plan.Ops_._M_elems[0x12] = Not;
  plan.Ops_._M_elems[0x13] = Not;
  plan.Ops_._M_elems[0x14] = Not;
  plan.Ops_._M_elems[0x15] = Not;
  plan.Ops_._M_elems[0x16] = Not;
  plan.Ops_._M_elems[0x17] = Not;
  plan.Ops_._M_elems[0x18] = Not;
  plan.Ops_._M_elems[0x19] = Not;
  plan.Ops_._M_elems[0x1a] = Not;
  plan.Ops_._M_elems[0x1b] = Not;
  plan.Ops_._M_elems[0x1c] = Not;
  plan.Ops_._M_elems[0x1d] = Not;
  plan.Ops_._M_elems[0x1e] = Not;
  plan.Ops_._M_elems[0x1f] = Not;
  plan.Ops_._M_elems[0x20] = Not;
  plan.Ops_._M_elems[0x21] = Not;
  plan.Ops_._M_elems[0x22] = Not;
  plan.Ops_._M_elems[0x23] = Not;
  plan.Ops_._M_elems[0x24] = Not;
  plan.Ops_._M_elems[0x25] = Not;
  plan.Ops_._M_elems[0x26] = Not;
  plan.Ops_._M_elems[0x27] = Not;
  plan.Ops_._M_elems[0x28] = Not;
  plan.Ops_._M_elems[0x29] = Not;
  plan.Ops_._M_elems[0x2a] = Not;
  plan.Ops_._M_elems[0x2b] = Not;
  plan.Ops_._M_elems[0x2c] = Not;
  plan.Ops_._M_elems[0x2d] = Not;
  plan.Ops_._M_elems[0x2e] = Not;
  plan.Ops_._M_elems[0x2f] = Not;
  _auStack_68 = ZEXT1632(ZEXT816(0) << 0x40);
  plan.Ops_._M_elems[0x38] = And;
  plan.Ops_._M_elems[0x39] = Not;
  plan.Ops_._M_elems[0x3a] = Not;
  plan.Ops_._M_elems[0x3b] = Not;
  plan.Ops_._M_elems[0x3c] = Not;
  plan.Ops_._M_elems[0x3d] = Not;
  plan.Ops_._M_elems[0x3e] = Not;
  plan.Ops_._M_elems[0x3f] = Not;
  lVar3 = 0;
  bVar5 = (__return_storage_ptr__->super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>)
          ._M_payload.super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_engaged;
  dVar11 = 0.0;
  lVar9 = 1;
  lVar7 = 0;
  dVar12 = 1.0;
  lVar4 = 1;
  while( true ) {
    if ((prob - dVar11 <= tol) && (dVar12 - prob <= tol)) {
      (__return_storage_ptr__->super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>).
      _M_payload.super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_engaged = bVar5;
      puVar6 = auStack_68 + plan.Ops_._M_elems._48_8_ + -1;
      if (auStack_68 < puVar6 && plan.Ops_._M_elems._48_8_ != 0) {
        puVar10 = auStack_68;
        do {
          puVar10 = puVar10 + 1;
          uVar1 = puVar10[-1];
          puVar10[-1] = *puVar6;
          *puVar6 = uVar1;
          puVar6 = puVar6 + -1;
        } while (puVar10 < puVar6);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>)._M_payload.
               super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload + 0x30) =
           plan.Ops_._M_elems._32_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>)._M_payload.
               super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload + 0x38) =
           plan.Ops_._M_elems._40_8_;
      (__return_storage_ptr__->super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>).
      _M_payload.super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload._M_value.
      NoOps_ = plan.Ops_._M_elems._48_8_;
      (__return_storage_ptr__->super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>).
      _M_payload.super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload._M_value.
      NoSrcBlocks_ = plan.Ops_._M_elems._56_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>)._M_payload.
               super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload + 0x20) =
           plan.Ops_._M_elems._16_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>)._M_payload.
               super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload + 0x28) =
           plan.Ops_._M_elems._24_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>)._M_payload.
               super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload + 0x30) =
           plan.Ops_._M_elems._32_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>)._M_payload.
               super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload + 0x38) =
           plan.Ops_._M_elems._40_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>).
        _M_payload.super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload =
           auStack_68._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>)._M_payload.
               super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload + 8) =
           auStack_68._8_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>)._M_payload.
               super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload + 0x10) =
           plan.Ops_._M_elems._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>)._M_payload.
               super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload + 0x18) =
           plan.Ops_._M_elems._8_8_;
      (__return_storage_ptr__->super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>).
      _M_payload.super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_engaged = true;
      return __return_storage_ptr__;
    }
    dVar2 = (dVar12 - dVar11) * 0.5 + dVar11;
    dVar13 = prob;
    if ((dVar2 != prob) || (NAN(dVar2) || NAN(prob))) {
      if (prob <= dVar2) {
        if (prob < dVar2) {
          dVar12 = dVar2;
        }
      }
      else {
        auStack_68[lVar7] = 0;
        lVar3 = lVar3 + 1;
        dVar11 = 1.0 - dVar12;
        lVar7 = lVar9;
        dVar13 = 1.0 - prob;
        dVar12 = 1.0 - dVar2;
      }
      auStack_68[lVar7] = 1;
      lVar3 = lVar3 + 1;
      plan.Ops_._M_elems._48_8_ = lVar3;
      lVar4 = lVar4 + 1;
      plan.Ops_._M_elems._56_8_ = lVar4;
      lVar8 = lVar7;
    }
    else {
      puVar6 = auStack_68 + lVar3 + -1;
      puVar10 = auStack_68;
      if (auStack_68 < puVar6 && lVar3 != 0) {
        do {
          puVar10 = puVar10 + 1;
          uVar1 = puVar10[-1];
          puVar10[-1] = *puVar6;
          *puVar6 = uVar1;
          puVar6 = puVar6 + -1;
        } while (puVar10 < puVar6);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>)._M_payload.
               super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload + 0x30) =
           plan.Ops_._M_elems._32_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>)._M_payload.
               super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload + 0x38) =
           plan.Ops_._M_elems._40_8_;
      (__return_storage_ptr__->super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>).
      _M_payload.super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload._M_value.
      NoOps_ = plan.Ops_._M_elems._48_8_;
      (__return_storage_ptr__->super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>).
      _M_payload.super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload._M_value.
      NoSrcBlocks_ = plan.Ops_._M_elems._56_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>)._M_payload.
               super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload + 0x20) =
           plan.Ops_._M_elems._16_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>)._M_payload.
               super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload + 0x28) =
           plan.Ops_._M_elems._24_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>)._M_payload.
               super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload + 0x30) =
           plan.Ops_._M_elems._32_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>)._M_payload.
               super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload + 0x38) =
           plan.Ops_._M_elems._40_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>).
        _M_payload.super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload =
           auStack_68._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>)._M_payload.
               super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload + 8) =
           auStack_68._8_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>)._M_payload.
               super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload + 0x10) =
           plan.Ops_._M_elems._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>)._M_payload.
               super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_payload + 0x18) =
           plan.Ops_._M_elems._8_8_;
      bVar5 = true;
      lVar8 = lVar7;
    }
    if ((dVar2 == prob) && (!NAN(dVar2) && !NAN(prob))) break;
    lVar9 = lVar8 + 2;
    lVar7 = lVar8 + 1;
    prob = dVar13;
    if (0x3d < lVar8) {
      (__return_storage_ptr__->super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>).
      _M_payload.super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_engaged = false;
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->super__Optional_base<NFastBernoulli::TExecutionPlan,_true,_true>).
  _M_payload.super__Optional_payload_base<NFastBernoulli::TExecutionPlan>._M_engaged = bVar5;
  return __return_storage_ptr__;
}

Assistant:

std::optional<TExecutionPlan> Quantize(double prob, double tol) noexcept {
    TExecutionPlan plan{.NoSrcBlocks_ = 1};
    double lhs = 0.0, rhs = 1.0;
    for (auto it = plan.Ops_.begin(); it + 1 < plan.Ops_.end(); ++it) {
        if (prob - lhs <= tol && rhs - prob <= tol) {
            std::reverse(plan.Ops_.begin(), plan.Ops_.begin() + plan.NoOps_);
            return plan;
        }

        double mid = lhs + 0.5 * (rhs - lhs);

        if (mid == prob) {
            std::reverse(plan.Ops_.begin(), plan.Ops_.begin() + plan.NoOps_);
            return plan;
        } else if (prob > mid) {
            *(it++) = EOp::Not;
            ++plan.NoOps_;
            prob = 1 - prob;
            lhs = 1 - rhs;
            rhs = 1 - mid;
        } else if (prob < mid) {
            rhs = mid;
        }

        // In any case append AND operation.
        *it = EOp::And;
        ++plan.NoOps_;
        ++plan.NoSrcBlocks_;
    }
    return std::nullopt;
}